

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationweights.cpp
# Opt level: O3

UBool __thiscall
icu_63::CollationWeights::getWeightRanges
          (CollationWeights *this,uint32_t lowerLimit,uint32_t upperLimit)

{
  WeightRange *pWVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  uint32_t uVar5;
  ulong uVar6;
  int32_t *piVar7;
  byte bVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int *piVar14;
  uint uVar15;
  long lVar16;
  int length;
  uint uVar17;
  long lVar18;
  long lVar19;
  WeightRange lower [5];
  WeightRange upper [5];
  undefined1 local_e8 [8];
  undefined1 local_e0 [8];
  int local_d8 [17];
  undefined1 auStack_94 [8];
  undefined1 auStack_8c [12];
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar11 = 1;
  uVar12 = 1;
  if ((lowerLimit & 0xffffff) != 0) {
    if ((short)lowerLimit == 0) {
      uVar12 = 2;
    }
    else {
      uVar12 = 4 - ((char)lowerLimit == '\0');
    }
  }
  if ((upperLimit & 0xffffff) != 0) {
    if ((short)upperLimit == 0) {
      uVar11 = 2;
    }
    else {
      uVar11 = 4 - ((char)upperLimit == '\0');
    }
  }
  if ((lowerLimit < upperLimit) &&
     ((uVar11 <= uVar12 ||
      (bVar8 = (char)uVar12 * -8, (upperLimit >> (bVar8 & 0x1f)) << (bVar8 & 0x1f) != lowerLimit))))
  {
    local_d8[0] = 0;
    local_d8[1] = 0;
    local_d8[2] = 0;
    local_d8[3] = 0;
    local_d8[4] = 0;
    local_d8[5] = 0;
    local_d8[6] = 0;
    local_d8[7] = 0;
    local_d8[8] = 0;
    local_d8[9] = 0;
    local_d8[10] = 0;
    local_d8[0xb] = 0;
    local_d8[0xc] = 0;
    local_d8[0xd] = 0;
    local_d8[0xe] = 0;
    local_d8[0xf] = 0;
    stack0xffffffffffffff68 = 0;
    stack0xffffffffffffff70 = 0;
    auStack_8c._4_8_ = 0;
    uStack_80 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    uStack_40 = 0;
    uVar17 = this->middleLength;
    local_e8 = (undefined1  [8])(ulong)uVar17;
    lVar19 = (long)(int)uVar17;
    if ((int)uVar17 < (int)uVar12) {
      uVar6 = (ulong)uVar12;
      piVar14 = local_d8 + uVar6 * 4 + 3;
      iVar10 = uVar12 * -8 + 0x20;
      do {
        bVar8 = (byte)iVar10;
        uVar15 = lowerLimit >> (bVar8 & 0x1f) & 0xff;
        uVar12 = this->maxBytes[uVar6];
        iVar13 = uVar12 - uVar15;
        if (uVar15 <= uVar12 && iVar13 != 0) {
          piVar14[-3] = (int)(1L << (bVar8 & 0x3f)) + lowerLimit;
          piVar14[-2] = uVar12 << (bVar8 & 0x1f) | -0x100 << (bVar8 & 0x1f) & lowerLimit;
          piVar14[-1] = (int)uVar6;
          *piVar14 = iVar13;
        }
        iVar10 = iVar10 + 8;
        lowerLimit = (lowerLimit >> ((byte)iVar10 & 0x1f)) << ((byte)iVar10 & 0x1f);
        uVar6 = uVar6 - 1;
        piVar14 = piVar14 + -4;
      } while (lVar19 < (long)uVar6);
    }
    bVar8 = (char)uVar17 * -8 + 0x20;
    uVar12 = 0xffffffff;
    if (lowerLimit < 0xff000000) {
      uVar12 = (int)(1L << (bVar8 & 0x3f)) + lowerLimit;
    }
    if ((int)uVar17 < (int)uVar11) {
      uVar6 = (ulong)uVar11;
      piVar14 = (int *)((long)&uStack_80 + uVar6 * 0x10 + 4);
      iVar10 = uVar11 * -8 + 0x20;
      do {
        bVar9 = (byte)iVar10;
        uVar15 = upperLimit >> (bVar9 & 0x1f) & 0xff;
        uVar11 = this->minBytes[uVar6];
        iVar13 = uVar15 - uVar11;
        if (uVar11 <= uVar15 && iVar13 != 0) {
          piVar14[-3] = uVar11 << (bVar9 & 0x1f) | -0x100 << (bVar9 & 0x1f) & upperLimit;
          piVar14[-2] = (int)(-1L << (bVar9 & 0x3f)) + upperLimit;
          piVar14[-1] = (int)uVar6;
          *piVar14 = iVar13;
        }
        iVar10 = iVar10 + 8;
        upperLimit = (upperLimit >> ((byte)iVar10 & 0x1f)) << ((byte)iVar10 & 0x1f);
        uVar6 = uVar6 - 1;
        piVar14 = piVar14 + -4;
      } while (lVar19 < (long)uVar6);
    }
    uVar11 = (int)(-1L << (bVar8 & 0x3f)) + upperLimit;
    if (uVar11 < uVar12) {
      local_e0 = (undefined1  [8])this;
      if ((int)uVar17 < 4) {
        lVar18 = 4;
        bVar8 = 0;
        lVar16 = 0x4c;
        do {
          iVar10 = *(int *)((long)local_d8 + lVar16);
          if ((0 < iVar10) && (iVar13 = *(int *)(auStack_8c + lVar16 + 4), 0 < iVar13)) {
            uVar5 = *(uint32_t *)(local_e0 + lVar16);
            uVar11 = *(uint *)(auStack_94 + lVar16);
            length = (int)lVar18;
            if (uVar11 < uVar5) {
              uVar11 = *(uint *)(auStack_94 + lVar16 + 4);
              *(uint *)(local_e0 + lVar16) = uVar11;
              iVar13 = ((uVar11 >> (bVar8 & 0x1f) & 0xff) -
                       (*(uint *)(local_e8 + lVar16 + 4) >> (bVar8 & 0x1f) & 0xff)) + 1;
            }
            else {
              if ((uVar5 == uVar11) ||
                 (uVar5 = incWeight((CollationWeights *)local_e0,uVar5,length), uVar5 != uVar11))
              goto LAB_0023040b;
              *(undefined4 *)(local_e0 + lVar16) = *(undefined4 *)(auStack_94 + lVar16 + 4);
              iVar13 = iVar13 + iVar10;
            }
            *(int *)((long)local_d8 + lVar16) = iVar13;
            *(undefined4 *)(auStack_8c + lVar16 + 4) = 0;
            if ((int)local_e8._0_4_ < length + -1) {
              lVar16 = (long)length + -1;
              lVar18 = (long)length * 0x10 + -4;
              do {
                *(undefined4 *)(auStack_8c + lVar18 + 4) = 0;
                *(undefined4 *)((long)local_d8 + lVar18) = 0;
                lVar16 = lVar16 + -1;
                lVar18 = lVar18 + -0x10;
              } while (lVar19 < lVar16);
            }
            break;
          }
LAB_0023040b:
          lVar18 = lVar18 + -1;
          bVar8 = bVar8 + 8;
          lVar16 = lVar16 + -0x10;
        } while (lVar19 < lVar18);
      }
      piVar7 = (int32_t *)((long)local_e0 + 0xa0);
      *(int32_t *)((long)local_e0 + 0xa0) = 0;
      iVar10 = 0;
      uVar17 = local_e8._0_4_;
    }
    else {
      piVar7 = &this->rangeCount;
      this->rangeCount = 0;
      local_e0 = (undefined1  [8])this;
      if ((int)(uVar11 - uVar12 >> (bVar8 & 0x1f)) < 0) {
        iVar10 = 0;
      }
      else {
        this->ranges[0].start = uVar12;
        this->ranges[0].end = uVar11;
        this->ranges[0].length = uVar17;
        this->ranges[0].count = (uVar11 - uVar12 >> (bVar8 & 0x1f)) + 1;
        this->rangeCount = 1;
        iVar10 = 1;
      }
    }
    if ((int)uVar17 < 4) {
      lVar16 = lVar19 + -4;
      lVar19 = lVar19 * 0x10 + 0x1c;
      do {
        if (0 < *(int *)(auStack_8c + lVar19 + 4)) {
          uVar2 = *(undefined8 *)(auStack_94 + lVar19);
          uVar3 = *(undefined8 *)(auStack_8c + lVar19);
          pWVar1 = ((CollationWeights *)local_e0)->ranges + iVar10;
          pWVar1->start = (int)uVar2;
          pWVar1->end = (int)((ulong)uVar2 >> 0x20);
          pWVar1->length = (int)uVar3;
          pWVar1->count = (int)((ulong)uVar3 >> 0x20);
          iVar10 = *piVar7 + 1;
          *piVar7 = iVar10;
        }
        if (0 < *(int *)((long)local_d8 + lVar19)) {
          uVar2 = *(undefined8 *)(local_e8 + lVar19 + 4);
          uVar3 = *(undefined8 *)(local_e0 + lVar19 + 4);
          pWVar1 = ((CollationWeights *)local_e0)->ranges + iVar10;
          pWVar1->start = (int)uVar2;
          pWVar1->end = (int)((ulong)uVar2 >> 0x20);
          pWVar1->length = (int)uVar3;
          pWVar1->count = (int)((ulong)uVar3 >> 0x20);
          iVar10 = *piVar7 + 1;
          *piVar7 = iVar10;
        }
        lVar19 = lVar19 + 0x10;
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0);
    }
    bVar4 = 0 < iVar10;
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

UBool
CollationWeights::getWeightRanges(uint32_t lowerLimit, uint32_t upperLimit) {
    U_ASSERT(lowerLimit != 0);
    U_ASSERT(upperLimit != 0);

    /* get the lengths of the limits */
    int32_t lowerLength=lengthOfWeight(lowerLimit);
    int32_t upperLength=lengthOfWeight(upperLimit);

#ifdef UCOL_DEBUG
    printf("length of lower limit 0x%08lx is %ld\n", lowerLimit, lowerLength);
    printf("length of upper limit 0x%08lx is %ld\n", upperLimit, upperLength);
#endif
    U_ASSERT(lowerLength>=middleLength);
    // Permit upperLength<middleLength: The upper limit for secondaries is 0x10000.

    if(lowerLimit>=upperLimit) {
#ifdef UCOL_DEBUG
        printf("error: no space between lower & upper limits\n");
#endif
        return FALSE;
    }

    /* check that neither is a prefix of the other */
    if(lowerLength<upperLength) {
        if(lowerLimit==truncateWeight(upperLimit, lowerLength)) {
#ifdef UCOL_DEBUG
            printf("error: lower limit 0x%08lx is a prefix of upper limit 0x%08lx\n", lowerLimit, upperLimit);
#endif
            return FALSE;
        }
    }
    /* if the upper limit is a prefix of the lower limit then the earlier test lowerLimit>=upperLimit has caught it */

    WeightRange lower[5], middle, upper[5]; /* [0] and [1] are not used - this simplifies indexing */
    uprv_memset(lower, 0, sizeof(lower));
    uprv_memset(&middle, 0, sizeof(middle));
    uprv_memset(upper, 0, sizeof(upper));

    /*
     * With the limit lengths of 1..4, there are up to 7 ranges for allocation:
     * range     minimum length
     * lower[4]  4
     * lower[3]  3
     * lower[2]  2
     * middle    1
     * upper[2]  2
     * upper[3]  3
     * upper[4]  4
     *
     * We are now going to calculate up to 7 ranges.
     * Some of them will typically overlap, so we will then have to merge and eliminate ranges.
     */
    uint32_t weight=lowerLimit;
    for(int32_t length=lowerLength; length>middleLength; --length) {
        uint32_t trail=getWeightTrail(weight, length);
        if(trail<maxBytes[length]) {
            lower[length].start=incWeightTrail(weight, length);
            lower[length].end=setWeightTrail(weight, length, maxBytes[length]);
            lower[length].length=length;
            lower[length].count=maxBytes[length]-trail;
        }
        weight=truncateWeight(weight, length-1);
    }
    if(weight<0xff000000) {
        middle.start=incWeightTrail(weight, middleLength);
    } else {
        // Prevent overflow for primary lead byte FF
        // which would yield a middle range starting at 0.
        middle.start=0xffffffff;  // no middle range
    }

    weight=upperLimit;
    for(int32_t length=upperLength; length>middleLength; --length) {
        uint32_t trail=getWeightTrail(weight, length);
        if(trail>minBytes[length]) {
            upper[length].start=setWeightTrail(weight, length, minBytes[length]);
            upper[length].end=decWeightTrail(weight, length);
            upper[length].length=length;
            upper[length].count=trail-minBytes[length];
        }
        weight=truncateWeight(weight, length-1);
    }
    middle.end=decWeightTrail(weight, middleLength);

    /* set the middle range */
    middle.length=middleLength;
    if(middle.end>=middle.start) {
        middle.count=(int32_t)((middle.end-middle.start)>>(8*(4-middleLength)))+1;
    } else {
        /* no middle range, eliminate overlaps */
        for(int32_t length=4; length>middleLength; --length) {
            if(lower[length].count>0 && upper[length].count>0) {
                // Note: The lowerEnd and upperStart weights are versions of
                // lowerLimit and upperLimit (which are lowerLimit<upperLimit),
                // truncated (still less-or-equal)
                // and then with their last bytes changed to the
                // maxByte (for lowerEnd) or minByte (for upperStart).
                const uint32_t lowerEnd=lower[length].end;
                const uint32_t upperStart=upper[length].start;
                UBool merged=FALSE;

                if(lowerEnd>upperStart) {
                    // These two lower and upper ranges collide.
                    // Since lowerLimit<upperLimit and lowerEnd and upperStart
                    // are versions with only their last bytes modified
                    // (and following ones removed/reset to 0),
                    // lowerEnd>upperStart is only possible
                    // if the leading bytes are equal
                    // and lastByte(lowerEnd)>lastByte(upperStart).
                    U_ASSERT(truncateWeight(lowerEnd, length-1)==
                            truncateWeight(upperStart, length-1));
                    // Intersect these two ranges.
                    lower[length].end=upper[length].end;
                    lower[length].count=
                            (int32_t)getWeightTrail(lower[length].end, length)-
                            (int32_t)getWeightTrail(lower[length].start, length)+1;
                    // count might be <=0 in which case there is no room,
                    // and the range-collecting code below will ignore this range.
                    merged=TRUE;
                } else if(lowerEnd==upperStart) {
                    // Not possible, unless minByte==maxByte which is not allowed.
                    U_ASSERT(minBytes[length]<maxBytes[length]);
                } else /* lowerEnd<upperStart */ {
                    if(incWeight(lowerEnd, length)==upperStart) {
                        // Merge adjacent ranges.
                        lower[length].end=upper[length].end;
                        lower[length].count+=upper[length].count;  // might be >countBytes
                        merged=TRUE;
                    }
                }
                if(merged) {
                    // Remove all shorter ranges.
                    // There was no room available for them between the ranges we just merged.
                    upper[length].count=0;
                    while(--length>middleLength) {
                        lower[length].count=upper[length].count=0;
                    }
                    break;
                }
            }
        }
    }

#ifdef UCOL_DEBUG
    /* print ranges */
    for(int32_t length=4; length>=2; --length) {
        if(lower[length].count>0) {
            printf("lower[%ld] .start=0x%08lx .end=0x%08lx .count=%ld\n", length, lower[length].start, lower[length].end, lower[length].count);
        }
    }
    if(middle.count>0) {
        printf("middle   .start=0x%08lx .end=0x%08lx .count=%ld\n", middle.start, middle.end, middle.count);
    }
    for(int32_t length=2; length<=4; ++length) {
        if(upper[length].count>0) {
            printf("upper[%ld] .start=0x%08lx .end=0x%08lx .count=%ld\n", length, upper[length].start, upper[length].end, upper[length].count);
        }
    }
#endif

    /* copy the ranges, shortest first, into the result array */
    rangeCount=0;
    if(middle.count>0) {
        uprv_memcpy(ranges, &middle, sizeof(WeightRange));
        rangeCount=1;
    }
    for(int32_t length=middleLength+1; length<=4; ++length) {
        /* copy upper first so that later the middle range is more likely the first one to use */
        if(upper[length].count>0) {
            uprv_memcpy(ranges+rangeCount, upper+length, sizeof(WeightRange));
            ++rangeCount;
        }
        if(lower[length].count>0) {
            uprv_memcpy(ranges+rangeCount, lower+length, sizeof(WeightRange));
            ++rangeCount;
        }
    }
    return rangeCount>0;
}